

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O3

void __thiscall HighsSymmetryDetection::removeFixPoints(HighsSymmetryDetection *this)

{
  uint uVar1;
  pointer ppVar2;
  pointer piVar3;
  pointer piVar4;
  int iVar5;
  ulong in_RAX;
  pointer ppVar6;
  pointer ppVar7;
  int *piVar8;
  int iVar9;
  HighsInt HVar10;
  int *piVar11;
  uint uVar12;
  int *piVar13;
  pointer piVar14;
  uint uVar15;
  long lVar16;
  pointer piVar17;
  ulong uVar18;
  pointer ppVar19;
  HighsInt j;
  long lVar20;
  ulong uVar21;
  long lVar22;
  int __tmp;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  std::vector<int,_std::allocator<int>_>::resize(&this->Gend,(long)this->numVertices);
  iVar5 = this->numVertices;
  if (0 < iVar5) {
    ppVar2 = (this->Gedge).
             super__Vector_base<std::pair<int,_unsigned_int>,_std::allocator<std::pair<int,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar14 = (this->Gstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar17 = (this->Gend).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar16 = 0;
    do {
      iVar5 = piVar14[lVar16];
      ppVar6 = ppVar2 + iVar5;
      iVar9 = piVar14[lVar16 + 1];
      if (iVar5 != iVar9) {
        piVar4 = (this->currentPartitionLinks).super__Vector_base<int,_std::allocator<int>_>._M_impl
                 .super__Vector_impl_data._M_start;
        piVar3 = (this->vertexToCell).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        ppVar7 = ppVar2 + iVar9;
        ppVar19 = ppVar6;
        do {
          while (ppVar6 = ppVar19, iVar5 = ppVar6->first, iVar9 = piVar3[iVar5],
                piVar4[iVar9] - iVar9 < 2) {
            do {
              ppVar19 = ppVar7;
              ppVar7 = ppVar19 + -1;
              if (ppVar7 == ppVar6) goto LAB_002f740f;
              iVar9 = piVar3[ppVar7->first];
            } while (piVar4[iVar9] - iVar9 < 2);
            ppVar6->first = ppVar7->first;
            ppVar7->first = iVar5;
            uVar15 = ppVar6->second;
            ppVar6->second = ppVar19[-1].second;
            ppVar19[-1].second = uVar15;
            ppVar19 = ppVar6 + 1;
            ppVar6 = ppVar7;
            if (ppVar7 == ppVar19) goto LAB_002f740f;
          }
          ppVar19 = ppVar6 + 1;
          ppVar6 = ppVar7;
        } while (ppVar19 != ppVar7);
      }
LAB_002f740f:
      piVar17[lVar16] = (int)((ulong)((long)ppVar6 - (long)ppVar2) >> 3);
      lVar16 = lVar16 + 1;
      iVar5 = this->numVertices;
    } while (lVar16 < iVar5);
  }
  piVar8 = (this->currentPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar11 = (this->currentPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish;
  uVar21 = (long)piVar11 - (long)piVar8;
  if (0 < (long)uVar21 >> 4) {
    piVar14 = (this->currentPartitionLinks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar17 = (this->vertexToCell).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar13 = (int *)((uVar21 & 0xfffffffffffffff0) + (long)piVar8);
    lVar16 = ((long)uVar21 >> 4) + 1;
    piVar8 = piVar8 + 2;
    do {
      lVar22 = (long)piVar8[-2];
      if (piVar14[piVar17[lVar22]] - piVar17[lVar22] == 1) {
        piVar8 = piVar8 + -2;
LAB_002f75eb:
        piVar13 = piVar17 + lVar22;
        goto LAB_002f75f2;
      }
      lVar22 = (long)piVar8[-1];
      if (piVar14[piVar17[lVar22]] - piVar17[lVar22] == 1) {
        piVar8 = piVar8 + -1;
        goto LAB_002f75eb;
      }
      lVar22 = (long)*piVar8;
      if (piVar14[piVar17[lVar22]] - piVar17[lVar22] == 1) goto LAB_002f75eb;
      lVar22 = (long)piVar8[1];
      if (piVar14[piVar17[lVar22]] - piVar17[lVar22] == 1) {
        piVar8 = piVar8 + 1;
        goto LAB_002f75eb;
      }
      lVar16 = lVar16 + -1;
      piVar8 = piVar8 + 4;
    } while (1 < lVar16);
    uVar21 = (long)piVar11 - (long)piVar13;
    piVar8 = piVar13;
  }
  lVar16 = (long)uVar21 >> 2;
  if (lVar16 == 3) {
    piVar14 = (this->currentPartitionLinks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar17 = (this->vertexToCell).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar16 = (long)*piVar8;
    if (piVar14[piVar17[lVar16]] - piVar17[lVar16] != 1) {
      piVar8 = piVar8 + 1;
      goto LAB_002f75b5;
    }
  }
  else {
    if (lVar16 == 2) {
      piVar14 = (this->currentPartitionLinks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar17 = (this->vertexToCell).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
LAB_002f75b5:
      lVar16 = (long)*piVar8;
      if (piVar14[piVar17[lVar16]] - piVar17[lVar16] == 1) goto LAB_002f75e1;
      piVar8 = piVar8 + 1;
    }
    else {
      if (lVar16 != 1) goto LAB_002f7645;
      piVar14 = (this->currentPartitionLinks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar17 = (this->vertexToCell).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
    }
    lVar16 = (long)*piVar8;
    if (piVar14[piVar17[lVar16]] - piVar17[lVar16] != 1) goto LAB_002f7645;
  }
LAB_002f75e1:
  piVar13 = piVar17 + lVar16;
LAB_002f75f2:
  iVar5 = iVar5 + -1;
  *piVar13 = iVar5;
  piVar13 = piVar8 + 1;
  if (piVar13 != piVar11 && piVar8 != piVar11) {
    do {
      iVar9 = *piVar13;
      if (piVar14[piVar17[iVar9]] - piVar17[iVar9] == 1) {
        iVar5 = iVar5 + -1;
        piVar17[iVar9] = iVar5;
      }
      else {
        *piVar8 = iVar9;
        piVar8 = piVar8 + 1;
      }
      piVar13 = piVar13 + 1;
    } while (piVar13 != piVar11);
  }
  if (piVar8 != piVar11) {
    (this->currentPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar8;
  }
LAB_002f7645:
  iVar5 = this->numVertices;
  if (0 < (long)iVar5) {
    piVar14 = (this->Gstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar17 = (this->Gend).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppVar2 = (this->Gedge).
             super__Vector_base<std::pair<int,_unsigned_int>,_std::allocator<std::pair<int,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar4 = (this->vertexToCell).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar16 = 0;
    do {
      iVar9 = piVar17[lVar16];
      lVar20 = (long)iVar9;
      lVar22 = lVar16 + 1;
      if (iVar9 < piVar14[lVar16 + 1]) {
        do {
          ppVar2[lVar20].first = piVar4[ppVar2[lVar20].first];
          lVar20 = lVar20 + 1;
        } while (lVar20 < piVar14[lVar22]);
      }
      lVar16 = lVar22;
    } while (lVar22 != iVar5);
  }
  iVar9 = (int)((ulong)((long)(this->currentPartition).super__Vector_base<int,_std::allocator<int>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->currentPartition).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 2);
  if (iVar9 < iVar5) {
    this->numVertices = iVar9;
    if (iVar9 == 0) {
      HVar10 = 0;
    }
    else {
      std::vector<int,_std::allocator<int>_>::resize(&this->currentPartitionLinks,(long)iVar9);
      uStack_28 = uStack_28 & 0xffffffffffffff;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_fill_assign
                (&this->cellInRefinementQueue,(long)this->numVertices,
                 (value_type_conflict5 *)((long)&uStack_28 + 7));
      piVar14 = (this->refinementQueue).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((this->refinementQueue).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish != piVar14) {
        (this->refinementQueue).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = piVar14;
      }
      iVar5 = this->numVertices;
      uVar21 = 0;
      piVar8 = (this->currentPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar14 = (this->currentPartitionLinks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (0 < iVar5) {
        piVar17 = (this->vertexToCell).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar18 = 0;
        uVar15 = 0;
        do {
          lVar16 = (long)piVar8[uVar18];
          uVar1 = piVar17[lVar16];
          uVar12 = (uint)uVar21;
          if (uVar12 != uVar1) {
            lVar16 = (long)(int)uVar15;
            uVar15 = (uint)uVar18;
            piVar14[lVar16] = uVar15;
            lVar16 = (long)piVar8[uVar18];
            uVar12 = piVar17[lVar16];
            uVar21 = (ulong)uVar1;
          }
          if ((uVar12 != uVar15) && (piVar17[lVar16] = uVar15, uVar18 != uVar15)) {
            piVar14[uVar18] = uVar15;
          }
          uVar18 = uVar18 + 1;
          iVar5 = this->numVertices;
        } while ((long)uVar18 < (long)iVar5);
        piVar8 = (this->currentPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar21 = (ulong)(int)uVar15;
      }
      piVar14[uVar21] = iVar5;
      uVar21 = (long)(this->currentPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)piVar8 >> 2;
      piVar11 = piVar8;
      if (0 < (long)uVar21) {
        do {
          uVar18 = uVar21 >> 1;
          uVar21 = ~uVar18 + uVar21;
          piVar13 = piVar11 + uVar18 + 1;
          if (this->numCol <= piVar11[uVar18]) {
            uVar21 = uVar18;
            piVar13 = piVar11;
          }
          piVar11 = piVar13;
        } while (0 < (long)uVar21);
      }
      HVar10 = (HighsInt)((ulong)((long)piVar11 - (long)piVar8) >> 2);
    }
  }
  else {
    HVar10 = this->numCol;
  }
  this->numActiveCols = HVar10;
  return;
}

Assistant:

void HighsSymmetryDetection::removeFixPoints() {
  Gend.resize(numVertices);
  for (HighsInt i = 0; i < numVertices; ++i) {
    Gend[i] =
        std::partition(Gedge.begin() + Gstart[i], Gedge.begin() + Gstart[i + 1],
                       [&](const std::pair<HighsInt, HighsUInt>& edge) {
                         return cellSize(vertexToCell[edge.first]) > 1;
                       }) -
        Gedge.begin();
    assert(Gend[i] >= Gstart[i] && Gend[i] <= Gstart[i + 1]);
  }

  HighsInt unitCellIndex = numVertices;
  currentPartition.erase(
      std::remove_if(currentPartition.begin(), currentPartition.end(),
                     [&](HighsInt vertex) {
                       if (cellSize(vertexToCell[vertex]) == 1) {
                         --unitCellIndex;
                         vertexToCell[vertex] = unitCellIndex;
                         return true;
                       }
                       return false;
                     }),
      currentPartition.end());

  for (HighsInt i = 0; i < numVertices; ++i) {
    if (Gend[i] == Gstart[i + 1]) continue;

    for (HighsInt j = Gend[i]; j < Gstart[i + 1]; ++j)
      Gedge[j].first = vertexToCell[Gedge[j].first];
  }

  if ((HighsInt)currentPartition.size() < numVertices) {
    numVertices = currentPartition.size();
    if (numVertices == 0) {
      numActiveCols = 0;
      return;
    }
    currentPartitionLinks.resize(numVertices);
    cellInRefinementQueue.assign(numVertices, false);
    assert(refinementQueue.empty());
    refinementQueue.clear();
    HighsInt cellStart = 0;
    HighsInt cellNumber = 0;
    for (HighsInt i = 0; i < numVertices; ++i) {
      HighsInt vertex = currentPartition[i];
      // if the cell number is different to the current cell number this is the
      // start of a new cell
      if (cellNumber != vertexToCell[vertex]) {
        // remember the number of this cell to identify its end
        cellNumber = vertexToCell[vertex];
        // set the link of the cell start to point to its end
        currentPartitionLinks[cellStart] = i;
        // remember start of this cell
        cellStart = i;
      }

      // correct the vertexToCell array to store the start index of the
      // cell, not its number
      updateCellMembership(i, cellStart, false);
    }

    // set the column partition link of the last started cell to point past the
    // end
    assert((int)currentPartitionLinks.size() > 0);
    currentPartitionLinks[cellStart] = numVertices;

    numActiveCols =
        std::partition_point(currentPartition.begin(), currentPartition.end(),
                             [&](HighsInt v) { return v < numCol; }) -
        currentPartition.begin();
  } else
    numActiveCols = numCol;
}